

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O2

TestCaseGroup * vkt::FragmentOperations::createScissorMultiViewportTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  int local_a8;
  allocator<char> local_a1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"multi_viewport","");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  for (local_a8 = 1;
      pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, local_a8 < 0x11; local_a8 = local_a8 + 1) {
    de::toString<int>(&local_70,&local_a8);
    std::operator+(&local_50,"scissor_",&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_a1);
    addFunctionCaseWithPrograms<int>
              (pTVar1,&local_50,&local_90,anon_unknown_0::initPrograms,anon_unknown_0::test,local_a8
              );
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createScissorMultiViewportTests	(tcu::TestContext& testCtx)
{
	MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "multi_viewport", ""));

	for (int numViewports = 1; numViewports <= MIN_MAX_VIEWPORTS; ++numViewports)
		addFunctionCaseWithPrograms(group.get(), "scissor_" + de::toString(numViewports), "", initPrograms, test, numViewports);

	return group.release();
}